

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::join<char_const(&)[23],unsigned_int&>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [23],uint *ts_1)

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1110;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1110);
  inner::join_helper<char_const(&)[23],unsigned_int&>(&local_1110,(char (*) [23])this,(uint *)ts);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1110);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1110);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}